

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

size_t ra_portable_size_in_bytes(roaring_array_t *ra)

{
  uint32_t uVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  int *piVar5;
  uint8_t uVar6;
  
  uVar1 = ra_portable_header_size(ra);
  uVar2 = (ulong)uVar1;
  if (0 < (long)ra->size) {
    lVar3 = 0;
    do {
      piVar5 = (int *)ra->containers[lVar3];
      uVar6 = ra->typecodes[lVar3];
      if (uVar6 == '\x04') {
        uVar6 = (uint8_t)piVar5[2];
        if (uVar6 == '\x04') {
          __assert_fail("*type != SHARED_CONTAINER_TYPE",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x1062,
                        "const container_t *container_unwrap_shared(const container_t *, uint8_t *)"
                       );
        }
        piVar5 = *(int **)piVar5;
      }
      if (uVar6 == '\x01') {
        iVar4 = 0x2000;
      }
      else if (uVar6 == '\x03') {
        iVar4 = *piVar5 * 4 + 2;
      }
      else {
        if (uVar6 != '\x02') {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x11a5,"int32_t container_size_in_bytes(const container_t *, uint8_t)");
        }
        iVar4 = *piVar5 * 2;
      }
      uVar2 = uVar2 + (long)iVar4;
      lVar3 = lVar3 + 1;
    } while (ra->size != lVar3);
  }
  return uVar2;
}

Assistant:

size_t ra_portable_size_in_bytes(const roaring_array_t *ra) {
    size_t count = ra_portable_header_size(ra);

    for (int32_t k = 0; k < ra->size; ++k) {
        count += container_size_in_bytes(ra->containers[k], ra->typecodes[k]);
    }
    return count;
}